

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::SelectGeneric<unsigned_long,_unsigned_long,_duckdb::NotEquals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  SelectionVector *result_sel;
  idx_t iVar1;
  Vector *in_R9;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *in_stack_ffffffffffffff00;
  idx_t in_stack_ffffffffffffff08;
  SelectionVector *in_stack_ffffffffffffff18;
  SelectionVector *in_stack_ffffffffffffff20;
  unsigned_long *in_stack_ffffffffffffff28;
  SelectionVector *in_stack_ffffffffffffff30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff50;
  ValidityMask *in_stack_ffffffffffffff58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff60;
  SelectionVector *in_stack_ffffffffffffff68;
  UnifiedVectorFormat *in_stack_ffffffffffffffb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb8;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff00);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff00);
  Vector::ToUnifiedFormat(in_R9,(idx_t)in_stack_ffffffffffffffb8._M_pi,in_stack_ffffffffffffffb0);
  Vector::ToUnifiedFormat(in_R9,(idx_t)in_stack_ffffffffffffffb8._M_pi,in_stack_ffffffffffffffb0);
  result_sel = (SelectionVector *)
               UnifiedVectorFormat::GetData<unsigned_long>
                         ((UnifiedVectorFormat *)&stack0xffffffffffffff78);
  UnifiedVectorFormat::GetData<unsigned_long>((UnifiedVectorFormat *)&stack0xffffffffffffff30);
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff40;
  iVar1 = SelectGenericLoopSwitch<unsigned_long,_unsigned_long,_duckdb::NotEquals>
                    ((unsigned_long *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,result_sel,
                     in_stack_ffffffffffffff08,(ValidityMask *)in_stack_ffffffffffffff50._M_pi,
                     in_stack_ffffffffffffff58,(SelectionVector *)in_stack_ffffffffffffff60._M_pi,
                     in_stack_ffffffffffffff68);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return iVar1;
}

Assistant:

static idx_t SelectGeneric(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                           SelectionVector *true_sel, SelectionVector *false_sel) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		return SelectGenericLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata), ldata.sel,
		    rdata.sel, sel, count, ldata.validity, rdata.validity, true_sel, false_sel);
	}